

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O1

void i18n_text_cb(Fl_Input *i,void *param_2)

{
  char **ppcVar1;
  
  undo_checkpoint();
  if (i18n_function_input == i) {
    ppcVar1 = &i18n_function;
  }
  else if (i18n_file_input == i) {
    ppcVar1 = &i18n_file;
  }
  else {
    if (i18n_include_input != i) goto LAB_0018b069;
    ppcVar1 = &i18n_include;
  }
  *ppcVar1 = (i->super_Fl_Input_).value_;
LAB_0018b069:
  set_modflag(1);
  return;
}

Assistant:

void i18n_text_cb(Fl_Input *i, void *) {
  undo_checkpoint();
  
  if (i == i18n_function_input)
    i18n_function = i->value();
  else if (i == i18n_file_input)
    i18n_file = i->value();
  else if (i == i18n_include_input)
    i18n_include = i->value();
  
  set_modflag(1);
}